

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_b8;
  ReusableStringStream local_a8;
  string local_90;
  SourceLineInfo local_60;
  ReusableStringStream local_50;
  string local_38;
  Code local_14;
  PosixColourImpl *pPStack_10;
  Code _colourCode_local;
  PosixColourImpl *this_local;
  
  local_14 = _colourCode;
  pPStack_10 = this;
  switch(_colourCode) {
  case None:
  case Headers:
    setColour(this,"[0m");
    break;
  case Red:
    setColour(this,"[0;31m");
    break;
  case Green:
    setColour(this,"[0;32m");
    break;
  case Blue:
    setColour(this,"[0;34m");
    break;
  case Cyan:
    setColour(this,"[0;36m");
    break;
  case Yellow:
    setColour(this,"[0;33m");
    break;
  case Grey:
    setColour(this,"[1;30m");
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_a8);
    SourceLineInfo::SourceLineInfo
              (&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/3rdparty/Catch2/catch.hpp"
               ,0x27d2);
    pRVar1 = ReusableStringStream::operator<<(&local_a8,&local_b8);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [25])"Unknown colour requested");
    ReusableStringStream::str_abi_cxx11_(&local_90,pRVar1);
    throw_logic_error(&local_90);
  case Bright:
    ReusableStringStream::ReusableStringStream(&local_50);
    SourceLineInfo::SourceLineInfo
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/3rdparty/Catch2/catch.hpp"
               ,0x27d1);
    pRVar1 = ReusableStringStream::operator<<(&local_50,&local_60);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
    pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [13])"not a colour");
    ReusableStringStream::str_abi_cxx11_(&local_38,pRVar1);
    throw_logic_error(&local_38);
  case BrightWhite:
    setColour(this,"[1;37m");
    break;
  case BrightRed:
    setColour(this,"[1;31m");
    break;
  case BrightGreen:
    setColour(this,"[1;32m");
    break;
  case BrightYellow:
    setColour(this,"[1;33m");
    break;
  case FileName:
    setColour(this,"[0;37m");
  }
  return;
}

Assistant:

void use( Colour::Code _colourCode ) override {
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }